

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::add_argument_buffer_padding_buffer_type
          (CompilerMSL *this,SPIRType *struct_type,uint32_t *mbr_idx,uint32_t *arg_buff_index,
          MSLResourceBinding *rez_bind)

{
  uint32_t uVar1;
  uint32_t uVar2;
  bool bVar3;
  bool bVar4;
  undefined2 uVar5;
  Dim DVar6;
  bool bVar7;
  undefined1 uVar8;
  ImageFormat IVar9;
  AccessQualifier AVar10;
  TypeID TVar11;
  TypeID TVar12;
  uint32_t id;
  SPIRType *pSVar13;
  SPIRType *pSVar14;
  uint32_t id_00;
  Op local_38 [2];
  
  id_00 = this->argument_buffer_padding_buffer_type_id;
  if (id_00 == 0) {
    id = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,2);
    local_38[1] = 0;
    pSVar13 = Compiler::set<spirv_cross::SPIRType,spv::Op>((Compiler *)this,id,local_38 + 1);
    pSVar13->basetype = rez_bind->basetype;
    pSVar13->storage = StorageClassUniformConstant;
    id_00 = id + 1;
    local_38[0] = OpTypePointer;
    pSVar14 = Compiler::set<spirv_cross::SPIRType,spv::Op>((Compiler *)this,id_00,local_38);
    (pSVar14->super_IVariant).self.id = (pSVar13->super_IVariant).self.id;
    uVar1 = pSVar13->width;
    uVar2 = pSVar13->vecsize;
    *(undefined8 *)&(pSVar14->super_IVariant).field_0xc =
         *(undefined8 *)&(pSVar13->super_IVariant).field_0xc;
    pSVar14->width = uVar1;
    pSVar14->vecsize = uVar2;
    pSVar14->columns = pSVar13->columns;
    SmallVector<unsigned_int,_8UL>::operator=(&pSVar14->array,&pSVar13->array);
    SmallVector<bool,_8UL>::operator=(&pSVar14->array_size_literal,&pSVar13->array_size_literal);
    bVar3 = pSVar13->pointer;
    bVar4 = pSVar13->forward_pointer;
    uVar5 = *(undefined2 *)&pSVar13->field_0x7e;
    pSVar14->pointer_depth = pSVar13->pointer_depth;
    pSVar14->pointer = bVar3;
    pSVar14->forward_pointer = bVar4;
    *(undefined2 *)&pSVar14->field_0x7e = uVar5;
    pSVar14->storage = pSVar13->storage;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
              (&pSVar14->member_types,&pSVar13->member_types);
    SmallVector<unsigned_int,_8UL>::operator=
              (&pSVar14->member_type_index_redirection,&pSVar13->member_type_index_redirection);
    DVar6 = (pSVar13->image).dim;
    bVar3 = (pSVar13->image).depth;
    bVar4 = (pSVar13->image).arrayed;
    bVar7 = (pSVar13->image).ms;
    uVar8 = (pSVar13->image).field_0xb;
    uVar1 = (pSVar13->image).sampled;
    IVar9 = (pSVar13->image).format;
    AVar10 = (pSVar13->image).access;
    TVar11.id = (pSVar13->type_alias).id;
    TVar12.id = (pSVar13->parent_type).id;
    (pSVar14->image).type = (TypeID)(pSVar13->image).type.id;
    (pSVar14->image).dim = DVar6;
    (pSVar14->image).depth = bVar3;
    (pSVar14->image).arrayed = bVar4;
    (pSVar14->image).ms = bVar7;
    (pSVar14->image).field_0xb = uVar8;
    (pSVar14->image).sampled = uVar1;
    (pSVar14->image).format = IVar9;
    (pSVar14->image).access = AVar10;
    pSVar14->type_alias = (TypeID)TVar11.id;
    pSVar14->parent_type = (TypeID)TVar12.id;
    if (pSVar13 != pSVar14) {
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&pSVar14->member_name_cache,&(pSVar13->member_name_cache)._M_h);
    }
    *(undefined4 *)&(pSVar14->super_IVariant).field_0xc = 0x20;
    pSVar14->pointer = true;
    pSVar14->pointer_depth = pSVar14->pointer_depth + 1;
    (pSVar14->parent_type).id = id;
    this->argument_buffer_padding_buffer_type_id = id_00;
  }
  add_argument_buffer_padding_type(this,id_00,struct_type,mbr_idx,arg_buff_index,rez_bind->count);
  return;
}

Assistant:

void CompilerMSL::add_argument_buffer_padding_buffer_type(SPIRType &struct_type, uint32_t &mbr_idx,
                                                          uint32_t &arg_buff_index, MSLResourceBinding &rez_bind)
{
	if (!argument_buffer_padding_buffer_type_id)
	{
		uint32_t buff_type_id = ir.increase_bound_by(2);
		auto &buff_type = set<SPIRType>(buff_type_id, OpNop);
		buff_type.basetype = rez_bind.basetype;
		buff_type.storage = StorageClassUniformConstant;

		uint32_t ptr_type_id = buff_type_id + 1;
		auto &ptr_type = set<SPIRType>(ptr_type_id, OpTypePointer);
		ptr_type = buff_type;
		ptr_type.op = spv::OpTypePointer;
		ptr_type.pointer = true;
		ptr_type.pointer_depth++;
		ptr_type.parent_type = buff_type_id;

		argument_buffer_padding_buffer_type_id = ptr_type_id;
	}

	add_argument_buffer_padding_type(argument_buffer_padding_buffer_type_id, struct_type, mbr_idx, arg_buff_index, rez_bind.count);
}